

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O0

void sort_rec3(float *array,int *perm,int size)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int local_30;
  int local_2c;
  int j;
  int i;
  int tmpi;
  float tmpf;
  float pivot;
  int size_local;
  int *perm_local;
  float *array_local;
  
  if (size < 0x10) {
    selectionsort3(array,perm,size);
  }
  else {
    fVar1 = array[size / 2];
    local_2c = -1;
    local_30 = size;
    while( true ) {
      do {
        local_2c = local_2c + 1;
      } while (array[local_2c] < fVar1);
      do {
        local_30 = local_30 + -1;
      } while (fVar1 < array[local_30]);
      if (local_30 <= local_2c) break;
      fVar2 = array[local_2c];
      array[local_2c] = array[local_30];
      array[local_30] = fVar2;
      iVar3 = perm[local_2c];
      perm[local_2c] = perm[local_30];
      perm[local_30] = iVar3;
    }
    sort_rec3(array,perm,local_2c);
    sort_rec3(array + local_2c,perm + local_2c,size - local_2c);
  }
  return;
}

Assistant:

static void sort_rec3(float* array, int* perm, int size)
{
    if (size <= 15)
        selectionsort3(array, perm, size);
    else{
        float  pivot = array[size/2];
        float  tmpf;
        int    tmpi;
        int    i = -1;
        int    j = size;
        for(;;){
            do i++; while(array[i] < pivot);
            do j--; while(pivot < array[j]);
            if (i >= j) break;
            tmpf = array[i]; array[i] = array[j]; array[j] = tmpf;
            tmpi = perm[i];  perm[i]  = perm[j];  perm[j]  = tmpi;
        }
        sort_rec3(array    , perm,     i     );
        sort_rec3(&array[i], &perm[i], size-i);
    }
}